

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int8_t __thiscall
icu_63::UnicodeString::doCompare
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UChar *pUVar1;
  ushort uVar2;
  byte bVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  char16_t *pcVar7;
  bool bVar8;
  int local_30;
  int local_2c;
  
  bVar3 = 0xff;
  if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x1) ==
      (undefined1  [56])0x0) {
    local_30 = length;
    local_2c = start;
    pinIndices(this,&local_2c,&local_30);
    if (srcChars == (UChar *)0x0) {
      bVar3 = local_30 != 0;
    }
    else {
      if ((undefined1  [56])((undefined1  [56])this->fUnion & (undefined1  [56])0x2) ==
          (undefined1  [56])0x0) {
        pcVar7 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&this->fUnion + 2);
      }
      lVar6 = (long)local_2c;
      pUVar1 = srcChars + srcStart;
      if (srcLength < 0) {
        srcLength = u_strlen_63(pUVar1 + srcStart);
      }
      bVar3 = -(local_30 < srcLength) | 1;
      bVar8 = local_30 == srcLength;
      if (local_30 < srcLength) {
        srcLength = local_30;
      }
      if (bVar8) {
        bVar3 = 0;
      }
      if ((0 < srcLength) && (pcVar7 + lVar6 != pUVar1)) {
        iVar5 = srcLength + 1;
        lVar4 = 0;
        do {
          uVar2 = *(ushort *)((long)(pcVar7 + lVar6) + lVar4);
          if (uVar2 != *(ushort *)((long)pUVar1 + lVar4)) {
            return (byte)((uint)uVar2 - (uint)*(ushort *)((long)pUVar1 + lVar4) >> 0xf) | 1;
          }
          lVar4 = lVar4 + 2;
          iVar5 = iVar5 + -1;
        } while (1 < iVar5);
      }
    }
  }
  return bVar3;
}

Assistant:

int8_t
UnicodeString::doCompare( int32_t start,
              int32_t length,
              const UChar *srcChars,
              int32_t srcStart,
              int32_t srcLength) const
{
  // compare illegal string values
  if(isBogus()) {
    return -1;
  }
  
  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    // treat const UChar *srcChars==NULL as an empty string
    return length == 0 ? 0 : 1;
  }

  // get the correct pointer
  const UChar *chars = getArrayStart();

  chars += start;
  srcChars += srcStart;

  int32_t minLength;
  int8_t lengthResult;

  // get the srcLength if necessary
  if(srcLength < 0) {
    srcLength = u_strlen(srcChars + srcStart);
  }

  // are we comparing different lengths?
  if(length != srcLength) {
    if(length < srcLength) {
      minLength = length;
      lengthResult = -1;
    } else {
      minLength = srcLength;
      lengthResult = 1;
    }
  } else {
    minLength = length;
    lengthResult = 0;
  }

  /*
   * note that uprv_memcmp() returns an int but we return an int8_t;
   * we need to take care not to truncate the result -
   * one way to do this is to right-shift the value to
   * move the sign bit into the lower 8 bits and making sure that this
   * does not become 0 itself
   */

  if(minLength > 0 && chars != srcChars) {
    int32_t result;

#   if U_IS_BIG_ENDIAN 
      // big-endian: byte comparison works
      result = uprv_memcmp(chars, srcChars, minLength * sizeof(UChar));
      if(result != 0) {
        return (int8_t)(result >> 15 | 1);
      }
#   else
      // little-endian: compare UChar units
      do {
        result = ((int32_t)*(chars++) - (int32_t)*(srcChars++));
        if(result != 0) {
          return (int8_t)(result >> 15 | 1);
        }
      } while(--minLength > 0);
#   endif
  }
  return lengthResult;
}